

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonQuoteFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  long in_FS_OFFSET;
  JsonString jx;
  JsonString local_a0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.zBuf = local_a0.zSpace;
  local_a0.nAlloc = 100;
  local_a0.nUsed = 0;
  local_a0.bStatic = '\x01';
  local_a0.bErr = '\0';
  local_a0.pCtx = ctx;
  jsonAppendValue(&local_a0,*argv);
  jsonResult(&local_a0);
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonQuoteFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString jx;
  UNUSED_PARAMETER(argc);

  jsonInit(&jx, ctx);
  jsonAppendValue(&jx, argv[0]);
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}